

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurse.cpp
# Opt level: O2

void __thiscall
Nurse::Nurse(Nurse *this,string *id,string *name,string *last_Name,string *phone_number,
            string *user_name,string password,string age,string field,string day,string time,
            string dammy)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_90,(string *)id);
  std::__cxx11::string::string((string *)&local_b0,(string *)name);
  std::__cxx11::string::string((string *)&local_d0,(string *)last_Name);
  std::__cxx11::string::string((string *)&local_f0,(string *)phone_number);
  std::__cxx11::string::string((string *)&local_110,(string *)user_name);
  std::__cxx11::string::string((string *)&local_50,(string *)password._M_dataplus._M_p);
  std::__cxx11::string::string((string *)&local_70,(string *)password._M_string_length);
  Human::Human(&this->super_Human,&local_90,&local_b0,&local_d0,&local_f0,&local_110,&local_50,
               &local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  (this->Day)._M_dataplus._M_p = (pointer)&(this->Day).field_2;
  (this->Day)._M_string_length = 0;
  (this->Day).field_2._M_local_buf[0] = '\0';
  (this->Time)._M_dataplus._M_p = (pointer)&(this->Time).field_2;
  (this->Time)._M_string_length = 0;
  (this->Time).field_2._M_local_buf[0] = '\0';
  (this->Field)._M_dataplus._M_p = (pointer)&(this->Field).field_2;
  (this->Field)._M_string_length = 0;
  (this->Field).field_2._M_local_buf[0] = '\0';
  this_00 = &this->nurse_all_ino;
  (this->nurse_all_ino).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nurse_all_ino).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nurse_all_ino).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&this->Field);
  std::__cxx11::string::_M_assign((string *)&this->Day);
  std::__cxx11::string::_M_assign((string *)&this->Time);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,id);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,last_Name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,phone_number);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,user_name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)password._M_dataplus._M_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)password._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)password.field_2._M_allocated_capacity);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)password.field_2._8_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,(value_type *)age._M_dataplus._M_p);
  return;
}

Assistant:

Nurse::Nurse(string id, string name, string last_Name, string phone_number, string user_name, string password, string age, string field, string day, string time,string dammy)
    :Human{ id,name,last_Name,phone_number,user_name,password,age } {
    Field = field;
    Day = day;
    Time = time;
    nurse_all_ino.push_back(id);
    nurse_all_ino.push_back(name);
    nurse_all_ino.push_back(last_Name);
    nurse_all_ino.push_back(phone_number);
    nurse_all_ino.push_back(user_name);
    nurse_all_ino.push_back(password);
    nurse_all_ino.push_back(age);
    nurse_all_ino.push_back(field);
    nurse_all_ino.push_back(day);
    nurse_all_ino.push_back(time);
}